

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O3

bool __thiscall
duckdb::RowVersionManager::Fetch(RowVersionManager *this,TransactionData transaction,idx_t row)

{
  int iVar1;
  reference pvVar2;
  undefined1 uVar3;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    uVar3 = 1;
    if (row >> 0xb <
        (ulong)((long)(this->vector_info).
                      super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->vector_info).
                      super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
               ::operator[](&this->vector_info,row >> 0xb);
      local_20._M_head_impl =
           (pvVar2->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
           _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>
           .super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
      if (local_20._M_head_impl != (ChunkInfo *)0x0) {
        optional_ptr<duckdb::ChunkInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::ChunkInfo,_true> *)&local_20);
        iVar1 = (*(local_20._M_head_impl)->_vptr_ChunkInfo[4])
                          (local_20._M_head_impl,(ulong)((uint)row & 0x7ff));
        uVar3 = (undefined1)iVar1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return (bool)uVar3;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

bool RowVersionManager::Fetch(TransactionData transaction, idx_t row) {
	lock_guard<mutex> lock(version_lock);
	idx_t vector_index = row / STANDARD_VECTOR_SIZE;
	auto info = GetChunkInfo(vector_index);
	if (!info) {
		return true;
	}
	return info->Fetch(transaction, UnsafeNumericCast<row_t>(row - vector_index * STANDARD_VECTOR_SIZE));
}